

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerAdapter.cxx
# Opt level: O2

void __thiscall cmDebugger::cmDebuggerAdapter::ReportExitCode(cmDebuggerAdapter *this,int exitCode)

{
  shared_ptr<cmDebugger::cmDebuggerThread> *this_00;
  ThreadEvent threadEvent;
  TerminatedEvent terminatedEvent;
  ExitedEvent local_88;
  ThreadEvent local_80;
  optional<dap::variant<std::vector<dap::any,_std::allocator<dap::any>_>,_dap::boolean,_dap::integer,_std::nullptr_t,_dap::number,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  
  this_00 = &this->DefaultThread;
  cmDebuggerThreadManager::EndThread
            ((this->ThreadManager)._M_t.
             super___uniq_ptr_impl<cmDebugger::cmDebuggerThreadManager,_std::default_delete<cmDebugger::cmDebuggerThreadManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmDebugger::cmDebuggerThreadManager_*,_std::default_delete<cmDebugger::cmDebuggerThreadManager>_>
             .super__Head_base<0UL,_cmDebugger::cmDebuggerThreadManager_*,_false>._M_head_impl,
             this_00);
  local_80.reason._M_dataplus._M_p = (pointer)&local_80.reason.field_2;
  local_80.reason._M_string_length = 0;
  local_80.reason.field_2._M_local_buf[0] = '\0';
  local_80.threadId.val = 0;
  std::__cxx11::string::assign((char *)&local_80);
  local_80.threadId.val =
       ((this_00->super___shared_ptr<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr)->Id;
  std::__shared_ptr<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2>::reset
            (&this_00->super___shared_ptr<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2>)
  ;
  local_88.exitCode.val = (integer)(long)exitCode;
  dap::
  optional<dap::variant<std::vector<dap::any,_std::allocator<dap::any>_>,_dap::boolean,_dap::integer,_std::nullptr_t,_dap::number,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::optional(&local_58);
  if (((this->SessionActive)._M_base._M_i & 1U) != 0) {
    dap::Session::send<dap::ThreadEvent,void>
              ((this->Session)._M_t.
               super___uniq_ptr_impl<dap::Session,_std::default_delete<dap::Session>_>._M_t.
               super__Tuple_impl<0UL,_dap::Session_*,_std::default_delete<dap::Session>_>.
               super__Head_base<0UL,_dap::Session_*,_false>._M_head_impl,&local_80);
    dap::Session::send<dap::ExitedEvent,void>
              ((this->Session)._M_t.
               super___uniq_ptr_impl<dap::Session,_std::default_delete<dap::Session>_>._M_t.
               super__Tuple_impl<0UL,_dap::Session_*,_std::default_delete<dap::Session>_>.
               super__Head_base<0UL,_dap::Session_*,_false>._M_head_impl,&local_88);
    dap::Session::send<dap::TerminatedEvent,void>
              ((this->Session)._M_t.
               super___uniq_ptr_impl<dap::Session,_std::default_delete<dap::Session>_>._M_t.
               super__Tuple_impl<0UL,_dap::Session_*,_std::default_delete<dap::Session>_>.
               super__Head_base<0UL,_dap::Session_*,_false>._M_head_impl,
               (TerminatedEvent *)&local_58);
  }
  SyncEvent::Wait((this->DisconnectEvent)._M_t.
                  super___uniq_ptr_impl<cmDebugger::SyncEvent,_std::default_delete<cmDebugger::SyncEvent>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cmDebugger::SyncEvent_*,_std::default_delete<cmDebugger::SyncEvent>_>
                  .super__Head_base<0UL,_cmDebugger::SyncEvent_*,_false>._M_head_impl);
  dap::any::~any((any *)&local_58);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void cmDebuggerAdapter::ReportExitCode(int exitCode)
{
  ThreadManager->EndThread(DefaultThread);
  dap::ThreadEvent threadEvent;
  threadEvent.reason = "exited";
  threadEvent.threadId = DefaultThread->GetId();
  DefaultThread.reset();

  dap::ExitedEvent exitEvent;
  exitEvent.exitCode = exitCode;

  dap::TerminatedEvent terminatedEvent;

  if (SessionActive.load()) {
    Session->send(threadEvent);
    Session->send(exitEvent);
    Session->send(terminatedEvent);
  }

  // Wait until disconnected or error.
  DisconnectEvent->Wait();
}